

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::GenerateNotesFile(cmCTest *this,char *cfiles)

{
  int iVar1;
  size_t sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream cmCTestLog_msg;
  undefined1 local_1b0 [32];
  string local_190 [3];
  ios_base local_120 [264];
  
  if (cfiles == (char *)0x0) {
    iVar1 = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Create notes file",0x11);
    std::ios::widen((char)local_190 + (char)*(undefined8 *)(local_190[0]._M_dataplus._M_p + -0x18));
    std::ostream::put((char)local_190);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x62b,(char *)local_1b0._0_8_,false);
    if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
      operator_delete((void *)local_1b0._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_1b0._16_8_)->_M_p + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
    sVar2 = strlen(cfiles);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,cfiles,cfiles + sVar2);
    cmsys::SystemTools::SplitString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b0,local_190,';',false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
      operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ == local_1b0._8_8_) {
      iVar1 = 1;
    }
    else {
      iVar1 = GenerateNotesFile(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_1b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b0);
  }
  return iVar1;
}

Assistant:

int cmCTest::GenerateNotesFile(const char* cfiles)
{
  if (!cfiles) {
    return 1;
  }

  cmCTestLog(this, OUTPUT, "Create notes file" << std::endl);

  std::vector<std::string> const files =
    cmSystemTools::SplitString(cfiles, ';');
  if (files.empty()) {
    return 1;
  }

  return this->GenerateNotesFile(files);
}